

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selector_table.cc
# Opt level: O2

uint sel_copyTypedSelectors_np(char *selName,SEL *sels,uint count)

{
  SEL poVar1;
  TypeList *pTVar2;
  uint uVar3;
  ulong uVar4;
  _Fwd_list_node_base *p_Var5;
  
  if (selName == (char *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    poVar1 = selector_lookup(selName,(char *)0x0);
    if ((poVar1 != (SEL)0x0) &&
       (pTVar2 = anon_unknown.dwarf_1ea71::selLookup(*(uint32_t *)&poVar1->field_0),
       pTVar2 != (TypeList *)0x0)) {
      p_Var5 = (pTVar2->super_forward_list<const_char_*,_std::allocator<const_char_*>_>).
               super__Fwd_list_base<const_char_*,_std::allocator<const_char_*>_>._M_impl._M_head.
               _M_next;
      if (count == 0) {
        uVar3 = 0xffffffff;
        do {
          p_Var5 = p_Var5->_M_next;
          uVar3 = uVar3 + 1;
        } while (p_Var5 != (_Fwd_list_node_base *)0x0);
      }
      else {
        uVar4 = 0;
        while( true ) {
          uVar3 = (uint)uVar4;
          p_Var5 = p_Var5->_M_next;
          if ((p_Var5 == (_Fwd_list_node_base *)0x0) || (count < uVar3)) break;
          poVar1 = selector_lookup(selName,(char *)p_Var5[1]._M_next);
          sels[uVar4] = poVar1;
          uVar4 = (ulong)(uVar3 + 1);
        }
      }
    }
  }
  return uVar3;
}

Assistant:

unsigned sel_copyTypedSelectors_np(const char *selName, SEL *const sels, unsigned count)
{
	if (nullptr == selName) { return 0; }
	SEL untyped = selector_lookup(selName, 0);
	if (untyped == nullptr) { return 0; }

	auto *l = selLookup(untyped->index);
	if (l == nullptr)
	{
		return 0;
	}

	if (count == 0)
	{
		for (auto type : *l)
		{
			count++;
		}
		return count;
	}

	unsigned found = 0;
	for (auto type : *l)
	{
		if (found > count)
		{
			break;
		}
		sels[found++] = selector_lookup(selName, type);
	}
	return found;
}